

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

uoffset_t __thiscall
flatbuffers::FlatBufferBuilder::EndTable
          (FlatBufferBuilder *this,uoffset_t start,voffset_t numfields)

{
  ushort uVar1;
  size_t sVar2;
  ushort *__s2;
  pointer pFVar3;
  pointer pFVar4;
  iterator __position;
  FlatBufferBuilder *pFVar5;
  int iVar6;
  uint8_t *puVar7;
  short *psVar8;
  undefined6 in_register_00000012;
  pointer pFVar9;
  unsigned_short litle_endian_element;
  uint uVar10;
  uint *puVar11;
  ulong len;
  uint8_t *puVar12;
  uoffset_t uVar13;
  uoffset_t vt_use;
  uint local_5c;
  uint8_t *local_58;
  FlatBufferBuilder *local_50;
  uint8_t *local_48;
  size_t local_40;
  uint8_t *local_38;
  
  Align(this,4);
  puVar7 = vector_downward::make_space(&this->buf_,4);
  puVar7[0] = '\0';
  puVar7[1] = '\0';
  puVar7[2] = '\0';
  puVar7[3] = '\0';
  puVar12 = (this->buf_).buf_ + ((this->buf_).reserved_ - (long)(this->buf_).cur_);
  iVar6 = (int)CONCAT62(in_register_00000012,numfields);
  len = (ulong)(uint)(iVar6 * 2);
  puVar7 = vector_downward::make_space(&this->buf_,len);
  if (iVar6 != 0) {
    memset(puVar7,0,len);
  }
  uVar10 = (int)puVar12 - start;
  if (0xffff < uVar10) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                  ,0x199,"uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)")
    ;
  }
  Align(this,2);
  puVar7 = vector_downward::make_space(&this->buf_,2);
  *(short *)puVar7 = (short)uVar10;
  Align(this,2);
  psVar8 = (short *)vector_downward::make_space(&this->buf_,2);
  *psVar8 = numfields * 2 + 4;
  sVar2 = (this->buf_).reserved_;
  puVar7 = (this->buf_).buf_;
  __s2 = (ushort *)(this->buf_).cur_;
  pFVar4 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar3 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pFVar9 = pFVar3; pFVar9 != pFVar4; pFVar9 = pFVar9 + 1) {
    if (*(short *)((long)__s2 + (ulong)pFVar9->id) != 0) {
      __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                    ,0x1a2,
                    "uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)");
    }
    *(short *)((long)__s2 + (ulong)pFVar9->id) = (short)puVar12 - (short)pFVar9->off;
  }
  local_38 = puVar7 + (sVar2 - (long)__s2);
  if (pFVar4 != pFVar3) {
    (this->offsetbuf_).
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
  }
  uVar1 = *__s2;
  local_5c = (uint)local_38;
  puVar11 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58 = puVar12;
  local_40 = sVar2;
  local_48 = puVar7;
  local_50 = this;
  do {
    if (puVar11 == __position._M_current) {
LAB_00102ffc:
      pFVar5 = local_50;
      puVar7 = local_58;
      if (local_5c == ((int)local_40 + (int)local_48) - *(int *)&(local_50->buf_).cur_) {
        if (__position._M_current ==
            (local_50->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50->vtables_,
                     __position,&local_5c);
        }
        else {
          *__position._M_current = local_5c;
          (local_50->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar13 = (uoffset_t)puVar7;
      *(uint *)((pFVar5->buf_).buf_ + ((pFVar5->buf_).reserved_ - ((ulong)puVar7 & 0xffffffff))) =
           local_5c - uVar13;
      return uVar13;
    }
    uVar10 = *puVar11;
    iVar6 = bcmp(puVar7 + (sVar2 - uVar10),__s2,(ulong)uVar1);
    if (iVar6 == 0) {
      (local_50->buf_).cur_ = (uint8_t *)((long)__s2 + (ulong)(uint)((int)local_38 - (int)local_58))
      ;
      local_5c = uVar10;
      goto LAB_00102ffc;
    }
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

uoffset_t EndTable(uoffset_t start, voffset_t numfields) {
    // Write the vtable offset, which is the start of any Table.
    // We fill it's value later.
    auto vtableoffsetloc = PushElement<uoffset_t>(0);
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    buf_.fill(numfields * sizeof(voffset_t));
    auto table_object_size = vtableoffsetloc - start;
    assert(table_object_size < 0x10000);  // Vtable use 16bit offsets.
    PushElement<voffset_t>(table_object_size);
    PushElement<voffset_t>(FieldIndexToOffset(numfields));
    // Write the offsets into the table
    for (auto field_location = offsetbuf_.begin();
              field_location != offsetbuf_.end();
            ++field_location) {
      auto pos = (vtableoffsetloc - field_location->off);
      // If this asserts, it means you've set a field twice.
      assert(!ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    offsetbuf_.clear();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = *vt1;
    auto vt_use = GetSize();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    for (auto it = vtables_.begin(); it != vtables_.end(); ++it) {
      if (memcmp(buf_.data_at(*it), vt1, vt1_size)) continue;
      vt_use = *it;
      buf_.pop(GetSize() - vtableoffsetloc);
      break;
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSize()) {
      vtables_.push_back(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the
    // vtable is stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtableoffsetloc),
                static_cast<soffset_t>(vt_use) -
                  static_cast<soffset_t>(vtableoffsetloc));
    return vtableoffsetloc;
  }